

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,char *ptr,int d)

{
  LogMessage *pLVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint overrun;
  pair<const_char_*,_bool> pVar6;
  LogMessage local_70;
  LogFinisher local_31;
  
  uVar5 = CONCAT44(in_register_00000014,d);
  if (ptr < this->limit_end_) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
               ,0x9f);
    pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: ptr >= limit_end_: ");
    LogFinisher::operator=(&local_31,pLVar1);
    LogMessage::~LogMessage(&local_70);
    uVar5 = extraout_RDX;
  }
  overrun = (int)ptr - *(int *)&this->buffer_end_;
  if (0x10 < (int)overrun) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
               ,0xa1);
    pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: overrun <= kSlopBytes: ");
    LogFinisher::operator=(&local_31,pLVar1);
    LogMessage::~LogMessage(&local_70);
    uVar5 = extraout_RDX_00;
  }
  uVar4 = this->limit_;
  if ((int)uVar4 < (int)overrun) {
LAB_0016126d:
    ptr = (char *)0x0;
LAB_00161259:
    uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
  }
  else {
    if (uVar4 == overrun) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                 ,0xa4);
      pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: overrun != limit_: ");
      LogFinisher::operator=(&local_31,pLVar1);
      LogMessage::~LogMessage(&local_70);
      uVar4 = this->limit_;
    }
    if ((int)uVar4 <= (int)overrun) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                 ,0xa5);
      pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: overrun < limit_: ");
      LogFinisher::operator=(&local_31,pLVar1);
      LogMessage::~LogMessage(&local_70);
      uVar4 = this->limit_;
    }
    if (this->limit_end_ != this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4)) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                 ,0xaa);
      pLVar1 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: limit_end_ == buffer_end_ + (std::min)(0, limit_): ");
      LogFinisher::operator=(&local_31,pLVar1);
      LogMessage::~LogMessage(&local_70);
      uVar4 = this->limit_;
    }
    if ((int)uVar4 < 1) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                 ,0xac);
      pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: limit_ > 0: ");
      LogFinisher::operator=(&local_31,pLVar1);
      LogMessage::~LogMessage(&local_70);
    }
    if (this->limit_end_ != this->buffer_end_) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                 ,0xad);
      pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: limit_end_ == buffer_end_: ");
      LogFinisher::operator=(&local_31,pLVar1);
      LogMessage::~LogMessage(&local_70);
    }
    do {
      if ((int)overrun < 0) {
        LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                   ,0xb0);
        pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=(&local_31,pLVar1);
        LogMessage::~LogMessage(&local_70);
      }
      pcVar2 = Next(this,overrun,d);
      if (pcVar2 == (char *)0x0) {
        uVar5 = extraout_RDX_01;
        if (overrun != 0) goto LAB_0016126d;
        if (this->limit_ < 1) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.cc"
                     ,0xb5);
          pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: limit_ > 0: ");
          LogFinisher::operator=(&local_31,pLVar1);
          LogMessage::~LogMessage(&local_70);
          uVar5 = extraout_RDX_02;
        }
        this->limit_end_ = this->buffer_end_;
        this->last_tag_minus_1_ = 1;
        goto LAB_00161259;
      }
      iVar3 = (int)this->buffer_end_;
      uVar4 = ((int)pcVar2 - iVar3) + this->limit_;
      this->limit_ = uVar4;
      ptr = pcVar2 + (int)overrun;
      overrun = (int)ptr - iVar3;
    } while (-1 < (int)overrun);
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
    uVar5 = 0;
  }
  pVar6._8_8_ = uVar5;
  pVar6.first = ptr;
  return pVar6;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(const char* ptr,
                                                              int d) {
  GOOGLE_DCHECK(ptr >= limit_end_);
  int overrun = ptr - buffer_end_;
  GOOGLE_DCHECK(overrun <= kSlopBytes);  // Guaranteed by parse loop.
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    auto p = Next(overrun, d);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinquish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {ptr, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    ptr = p + overrun;
    overrun = ptr - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {ptr, false};
}